

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetInputName(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,char *inputName)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  IOTHUB_MESSAGE_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_RESULT result;
  char *inputName_local;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle_local;
  
  if ((iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) || (inputName == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetInputName",0x3d7,1,
                "Invalid argument (iotHubMessageHandle=%p, inputName=%p)",iotHubMessageHandle,
                inputName);
    }
    l._4_4_ = IOTHUB_MESSAGE_INVALID_ARG;
  }
  else {
    if (iotHubMessageHandle->inputName != (char *)0x0) {
      free(iotHubMessageHandle->inputName);
      iotHubMessageHandle->inputName = (char *)0x0;
    }
    iVar1 = mallocAndStrcpy_s(&iotHubMessageHandle->inputName,inputName);
    if (iVar1 == 0) {
      l._4_4_ = IOTHUB_MESSAGE_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_SetInputName",0x3e6,1,"Failed saving a copy of inputName");
      }
      l._4_4_ = IOTHUB_MESSAGE_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetInputName(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const char* inputName)
{
    IOTHUB_MESSAGE_RESULT result;

    if ((iotHubMessageHandle == NULL) || (inputName == NULL))
    {
        LogError("Invalid argument (iotHubMessageHandle=%p, inputName=%p)", iotHubMessageHandle, inputName);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = (IOTHUB_MESSAGE_HANDLE_DATA*)iotHubMessageHandle;

        if (handleData->inputName != NULL)
        {
            free(handleData->inputName);
            handleData->inputName = NULL;
        }

        if (mallocAndStrcpy_s(&handleData->inputName, inputName) != 0)
        {
            LogError("Failed saving a copy of inputName");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }

    }

    return result;
}